

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O2

ArrowSchemaMetadata *
duckdb::ArrowSchemaMetadata::ArrowCanonicalType
          (ArrowSchemaMetadata *__return_storage_ptr__,string *extension_name)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  ArrowSchemaMetadata(__return_storage_ptr__);
  ::std::__cxx11::string::string((string *)&local_50,"ARROW:extension:name",(allocator *)&local_30);
  AddOption(__return_storage_ptr__,&local_50,extension_name);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string((string *)&local_50,"ARROW:extension:metadata",&local_51);
  ::std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_4b71df5 + 9,&local_52);
  AddOption(__return_storage_ptr__,&local_50,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

ArrowSchemaMetadata ArrowSchemaMetadata::ArrowCanonicalType(const string &extension_name) {
	ArrowSchemaMetadata metadata;
	metadata.AddOption(ARROW_EXTENSION_NAME, extension_name);
	metadata.AddOption(ARROW_METADATA_KEY, "");
	return metadata;
}